

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_info.cpp
# Opt level: O3

AlterEntryData * __thiscall
duckdb::AlterInfo::GetAlterEntryData(AlterEntryData *__return_storage_ptr__,AlterInfo *this)

{
  (__return_storage_ptr__->catalog)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->catalog).field_2;
  (__return_storage_ptr__->catalog)._M_string_length = 0;
  (__return_storage_ptr__->catalog).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->schema)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->schema).field_2;
  (__return_storage_ptr__->schema)._M_string_length = 0;
  (__return_storage_ptr__->schema).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->schema);
  ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
  __return_storage_ptr__->if_not_found = (this->super_ParseInfo).field_0xa;
  return __return_storage_ptr__;
}

Assistant:

AlterEntryData AlterInfo::GetAlterEntryData() const {
	AlterEntryData data;
	data.catalog = catalog;
	data.schema = schema;
	data.name = name;
	data.if_not_found = if_not_found;
	return data;
}